

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uenum.cpp
# Opt level: O0

char * uenum_nextDefault_63(UEnumeration *en,int32_t *resultLength,UErrorCode *status)

{
  UChar *us;
  UChar *tempUCharVal;
  char *tempCharVal;
  UErrorCode *status_local;
  int32_t *resultLength_local;
  UEnumeration *en_local;
  
  if (en->uNext == (UEnumUNext *)0x0) {
    *status = U_UNSUPPORTED_ERROR;
    en_local = (UEnumeration *)0x0;
  }
  else {
    us = (*en->uNext)(en,resultLength,status);
    if (us == (UChar *)0x0) {
      en_local = (UEnumeration *)0x0;
    }
    else {
      en_local = (UEnumeration *)_getBuffer(en,*resultLength + 1);
      if (en_local == (UEnumeration *)0x0) {
        *status = U_MEMORY_ALLOCATION_ERROR;
        en_local = (UEnumeration *)0x0;
      }
      else {
        u_UCharsToChars_63(us,(char *)en_local,*resultLength + 1);
      }
    }
  }
  return (char *)en_local;
}

Assistant:

U_CAPI const char* U_EXPORT2
uenum_nextDefault(UEnumeration* en,
            int32_t* resultLength,
            UErrorCode* status)
{
    if (en->uNext != NULL) {
        char *tempCharVal;
        const UChar *tempUCharVal = en->uNext(en, resultLength, status);
        if (tempUCharVal == NULL) {
            return NULL;
        }
        tempCharVal = (char*)
            _getBuffer(en, (*resultLength+1) * sizeof(char));
        if (!tempCharVal) {
            *status = U_MEMORY_ALLOCATION_ERROR;
            return NULL;
        }
        u_UCharsToChars(tempUCharVal, tempCharVal, *resultLength + 1);
        return tempCharVal;
    } else {
        *status = U_UNSUPPORTED_ERROR;
        return NULL;
    }
}